

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O3

void __thiscall xLearn::AccMetricTest_acc_test_Test::TestBody(AccMetricTest_acc_test_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  ThreadPool *this_00;
  char *pcVar4;
  undefined1 auVar5 [16];
  AssertionResult gtest_ar_2;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  AccMetric metric;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  Message local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_68;
  AccMetric local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_50.super_Metric._vptr_Metric._0_4_ = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&local_68,(iterator)0x0,(float *)&local_50);
  local_50.super_Metric._vptr_Metric._0_4_ = 0x3f800000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0xbf800000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = -1.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0xbf800000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = -1.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_50.super_Metric._vptr_Metric._0_4_ = 0x42c80000;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&local_88,(iterator)0x0,(float *)&local_50);
  local_50.super_Metric._vptr_Metric._0_4_ = 0x42000000;
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 32.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41400000;
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 12.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(local_50.super_Metric._vptr_Metric._4_4_,0xc1a80000);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = -21.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric = (_func_int **)&PTR__Metric_0016da48;
  local_50.total_example_ = 0;
  local_50.true_pred_ = 0;
  uVar3 = std::thread::hardware_concurrency();
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar3);
  local_50.super_Metric.threadNumber_ =
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_50.super_Metric.pool_ = this_00;
  AccMetric::Accumulate(&local_50,&local_68,&local_88);
  auVar1._8_8_ = 0;
  auVar1._0_4_ = local_50.total_example_;
  auVar1._4_4_ = local_50.true_pred_;
  auVar5 = vcvtudq2pd_avx512vl(auVar1);
  auVar1 = vshufpd_avx(auVar5,auVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_30,"metric_val","(3.0 / 4.0)",(float)(auVar1._0_8_ / auVar5._0_8_),
             0.75);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_98);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x30,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.total_example_ = 0;
  local_50.true_pred_ = 0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 1.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = -1.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = -1.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 1.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = -12.0;
  AccMetric::Accumulate(&local_50,&local_68,&local_88);
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_50.total_example_;
  auVar5._4_4_ = local_50.true_pred_;
  auVar5 = vcvtudq2pd_avx512vl(auVar5);
  auVar1 = vshufpd_avx(auVar5,auVar5,1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_30,"metric_val","(1.0 / 4.0)",(float)(auVar1._0_8_ / auVar5._0_8_),
             0.25);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_98);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x3c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_98.ss_.ptr_._1_7_,local_98.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.field_2._M_allocated_capacity = 0x7963726175636341;
  local_30._M_string_length = 8;
  local_30.field_2._M_local_buf[8] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&local_98,"metric.metric_type()","\"Accuarcy\"",&local_30,
             (char (*) [9])"Accuarcy");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_98.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric_test.cc"
               ,0x3d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_30._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}